

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:246:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:246:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr_untyped gStack_38;
  gc_heap_ptr_untyped local_28;
  
  anon_unknown_65::get_function_object_ptr((anon_unknown_65 *)&local_28,this_);
  function_object::bind((int)&gStack_38,(sockaddr *)&local_28,(socklen_t)args);
  value::value(__return_storage_ptr__,(object_ptr *)&gStack_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_28);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }